

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::eval_test::eval_test(eval_test *this)

{
  eval_test *this_local;
  
  compile_fixture_skiwi::compile_fixture_skiwi((compile_fixture_skiwi *)this);
  return;
}

Assistant:

void test()
      {
      using namespace skiwi;
      build_eval();
      uint64_t res = skiwi_run_raw("(eval '(+ 3 4))");
      TEST_EQ("7", skiwi_raw_to_string(res));
      res = skiwi_run_raw("(define (eval-formula formula) (eval `(let([x 2] [y 3]) ,formula)))");
      TEST_EQ("<lambda>", skiwi_raw_to_string(res));
      res = skiwi_run_raw("(eval-formula '(+ x y))");
      TEST_EQ("5", skiwi_raw_to_string(res));
      res = skiwi_run_raw("(eval-formula '(+ (* x y) y))");
      TEST_EQ("9", skiwi_raw_to_string(res));
      }